

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O2

void __thiscall ftxui::BgColor::BgColor(BgColor *this,Element *child,Color color)

{
  Element local_28;
  
  local_28.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (child->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  NodeDecorator::NodeDecorator(&this->super_NodeDecorator,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_28.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_NodeDecorator).super_Node._vptr_Node = (_func_int **)&PTR__Node_00169038;
  (this->super_NodeDecorator).super_Node.field_0x5c = color.type_;
  (this->super_NodeDecorator).super_Node.field_0x5d = color.field_1;
  (this->super_NodeDecorator).super_Node.field_0x5e = color.green_;
  (this->super_NodeDecorator).super_Node.field_0x5f = color.blue_;
  return;
}

Assistant:

BgColor(Element child, Color color)
      : NodeDecorator(std::move(child)), color_(color) {}